

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8decoder.cpp
# Opt level: O0

int __thiscall Utf8Decoder::decode(Utf8Decoder *this,int character)

{
  uint uVar1;
  uint32_t esc24;
  uint32_t esc16;
  int character_local;
  Utf8Decoder *this_local;
  
  this_local._4_4_ = character;
  if (0x7f < character) {
    this->esc = this->esc << 8 | character;
    uVar1 = this->esc & 0xffff;
    if (uVar1 == 0xc384) {
      this_local._4_4_ = 0x81;
    }
    else if (uVar1 == 0xc3a4) {
      this_local._4_4_ = 0x85;
    }
    else if (uVar1 == 0xc396) {
      this_local._4_4_ = 0x82;
    }
    else if (uVar1 == 0xc3b6) {
      this_local._4_4_ = 0x86;
    }
    else if (uVar1 == 0xc39c) {
      this_local._4_4_ = 0x83;
    }
    else if (uVar1 == 0xc3bc) {
      this_local._4_4_ = 0x87;
    }
    else if (uVar1 == 0xc39f) {
      this_local._4_4_ = 0x84;
    }
    else if ((this->esc & 0xffffff) == 0xe282ac) {
      this_local._4_4_ = 0x80;
    }
    else {
      this_local._4_4_ = -1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int Utf8Decoder::decode(const int character)
{
   //ASCII char 0 .. 0x7E
   if (character < 0x80)
   {
      // esc = 0;
      return character;
   }

   //UTF8 byte sequence
   esc = (esc << 8) | character;
   const uint32_t esc16 = esc & 0xFFFFuL;    //16-bit
   const uint32_t esc24 = esc & 0xFFFFFFuL;  //24-bit

   //Ä
   if (esc16 == 0xC384)
   {
      // esc = 0;
      return CHARACTER_CODE_UPPER_AE;
   }
   //ä
   if (esc16 == 0xC3A4)
   {
      // esc = 0;
      return CHARACTER_CODE_LOWER_ae;
   }
   //Ö
   if (esc16 == 0xC396)
   {
      // esc = 0;
      return CHARACTER_CODE_UPPER_OE;
   }
   //ö
   if (esc16 == 0xC3B6)
   {
      // esc = 0;
      return CHARACTER_CODE_LOWER_oe;
   }
   //Ü
   if (esc16 == 0xC39C)
   {
      // esc = 0;
      return CHARACTER_CODE_UPPER_UE;
   }
   //ü
   if (esc16 == 0xC3BC)
   {
      // esc = 0;
      return CHARACTER_CODE_LOWER_ue;
   }
   //Sz (scharfes S)
   if (esc16 == 0xC39F)
   {
      // esc = 0;
      return CHARACTER_CODE_SZ;
   }
   //EURO Symbol
   if (esc24 == 0xE282AC)
   {
      // esc = 0;
      return CHARACTER_CODE_EURO;
   }

   //unsupported (unicode) char
   return -1;
}